

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

UVec4 __thiscall tcu::getFormatMaxUintValue(tcu *this,TextureFormat *format)

{
  ChannelOrder CVar1;
  ChannelType CVar2;
  int i;
  long lVar3;
  uint *puVar4;
  uint *puVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  UVec4 UVar10;
  UVec4 UVar11;
  
  CVar1 = format->order;
  CVar2 = format->type;
  puVar4 = (uint *)(ulong)CONCAT31((int3)(CVar1 >> 8),
                                   (CVar1 == BGRA || CVar1 == RGBA) &&
                                   CVar2 == UNSIGNED_INT_1010102_REV);
  if ((CVar1 == BGRA || CVar1 == RGBA) && CVar2 == UNSIGNED_INT_1010102_REV) {
    uVar6 = 0x3ff;
    uVar7 = 0x3ff;
    uVar8 = 0x3ff;
    uVar9 = 3;
    puVar5 = puVar4;
    goto LAB_00917106;
  }
  puVar5 = &switchD_00917121::switchdataD_00a059a0;
  switch(CVar2) {
  case UNSIGNED_INT8:
    lVar3 = 0;
    do {
      *(undefined4 *)(this + lVar3 * 4) = 0xff;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case UNSIGNED_INT16:
    lVar3 = 0;
    do {
      *(undefined4 *)(this + lVar3 * 4) = 0xffff;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case UNSIGNED_INT24:
    lVar3 = 0;
    do {
      *(undefined4 *)(this + lVar3 * 4) = 0xffffff;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    break;
  case UNSIGNED_INT32:
    uVar8 = 0xffffffff;
    uVar6 = 0xffffffff;
    uVar7 = 0xffffffff;
    uVar9 = 0xffffffff;
    goto LAB_00917106;
  default:
    uVar6 = 0;
    uVar7 = 0;
    uVar8 = 0;
    uVar9 = 0;
    puVar5 = puVar4;
LAB_00917106:
    *(undefined4 *)this = uVar6;
    *(undefined4 *)(this + 4) = uVar7;
    *(undefined4 *)(this + 8) = uVar8;
    *(undefined4 *)(this + 0xc) = uVar9;
    UVar10.m_data._8_8_ = puVar5;
    UVar10.m_data._0_8_ = this;
    return (UVec4)UVar10.m_data;
  }
  UVar11.m_data._8_8_ = &switchD_00917121::switchdataD_00a059a0;
  UVar11.m_data._0_8_ = this;
  return (UVec4)UVar11.m_data;
}

Assistant:

UVec4 getFormatMaxUintValue (const TextureFormat& format)
{
	DE_ASSERT(getTextureChannelClass(format.type) == TEXTURECHANNELCLASS_UNSIGNED_INTEGER);

	if (format == TextureFormat(TextureFormat::RGBA, TextureFormat::UNSIGNED_INT_1010102_REV) ||
		format == TextureFormat(TextureFormat::BGRA, TextureFormat::UNSIGNED_INT_1010102_REV))
		return UVec4(1023u, 1023u, 1023u, 3u);

	switch (format.type)
	{
		case TextureFormat::UNSIGNED_INT8:	return UVec4(std::numeric_limits<deUint8>::max());
		case TextureFormat::UNSIGNED_INT16:	return UVec4(std::numeric_limits<deUint16>::max());
		case TextureFormat::UNSIGNED_INT24:	return UVec4(0xffffffu);
		case TextureFormat::UNSIGNED_INT32:	return UVec4(std::numeric_limits<deUint32>::max());

		default:
			DE_FATAL("Invalid channel type");
			return UVec4(0);
	}
}